

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O3

void __thiscall trackerboy::apu::Hardware::reset(Hardware *this)

{
  uchar *puVar1;
  _Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  *p_Var2;
  _Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  *p_Var3;
  _Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel> *p_Var4;
  long lVar5;
  
  lVar5 = 4;
  do {
    *(undefined1 *)((long)(this->mLengthCounters)._M_elems + lVar5 + -4) = 0;
    *(undefined4 *)(&(this->mLengthCounters)._M_elems[0].mEnabled + lVar5) = 0;
    lVar5 = lVar5 + 0xc;
  } while (lVar5 != 0x34);
  *(undefined8 *)&(this->mEnvelopes)._M_elems[1].mPeriod = 0;
  (this->mEnvelopes)._M_elems[0].mRegister = '\0';
  (this->mEnvelopes)._M_elems[0].mCounter = '\0';
  (this->mEnvelopes)._M_elems[0].mPeriod = '\0';
  (this->mEnvelopes)._M_elems[0].mAmplify = false;
  (this->mEnvelopes)._M_elems[0].mVolume = '\0';
  (this->mEnvelopes)._M_elems[1].mRegister = '\0';
  (this->mEnvelopes)._M_elems[1].mCounter = '\0';
  (this->mEnvelopes)._M_elems[1].mPeriod = '\0';
  (this->mSweep).mShadow = 0;
  (this->mSweep).mSubtraction = false;
  (this->mSweep).mTime = '\0';
  (this->mSweep).mShift = '\0';
  (this->mSweep).mCounter = '\0';
  (this->mSweep).mRegister = '\0';
  (this->mSequencer).mTimer.mCounter = 0x4000;
  (this->mSequencer).mTimer.mPeriod = 0x4000;
  (this->mSequencer).mTriggerIndex = 0;
  (this->mChannels).
  super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  .super__Head_base<0UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.super_Channel.mTimer.
  mPeriod = 0x2000;
  (this->mChannels).
  super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  .super__Head_base<0UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.mDutyCounter = 0;
  (this->mChannels).
  super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  .super__Head_base<0UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.mDuty = '\x03';
  (this->mChannels).
  super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  .super__Head_base<0UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.mDutyWaveform = '~';
  (this->mChannels).
  super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  .super__Head_base<0UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.super_Channel.mEnabled =
       false;
  *(uint32_t *)
   ((long)&(this->mChannels).
           super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
           .
           super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
           .super__Head_base<1UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.super_Channel.
           mTimer + 4) = 0x2000;
  *(undefined8 *)
   &(this->mChannels).
    super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
    .
    super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
    .super__Head_base<1UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.mDutyCounter = 0;
  p_Var2 = &(this->mChannels).
            super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  ;
  (p_Var2->
  super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  ).super__Head_base<1UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.mDuty = '\x03';
  (p_Var2->
  super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  ).super__Head_base<1UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.mDutyWaveform = '~';
  p_Var3 = &(this->mChannels).
            super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
            .
            super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  ;
  (p_Var3->super__Head_base<1UL,_trackerboy::apu::PulseChannel,_false>)._M_head_impl.super_Channel.
  mFrequency = 0;
  (p_Var3->super__Head_base<1UL,_trackerboy::apu::PulseChannel,_false>)._M_head_impl.super_Channel.
  mOutput = '\0';
  (p_Var3->super__Head_base<1UL,_trackerboy::apu::PulseChannel,_false>)._M_head_impl.super_Channel.
  mDacOn = false;
  (this->mChannels).
  super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  .
  super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  .super__Head_base<1UL,_trackerboy::apu::PulseChannel,_false>._M_head_impl.super_Channel.mEnabled =
       false;
  *(uint32_t *)
   ((long)&(this->mChannels).
           super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
           .
           super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
           .super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>.
           super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.super_Channel +
   0xc) = 0x1000;
  *(bool *)((long)&(this->mChannels).
                   super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                   .
                   super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                   .
                   super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                   .super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.
                   super_Channel + 4) = false;
  p_Var4 = &(this->mChannels).
            super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
            .
            super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
            .super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>;
  (p_Var4->super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>)._M_head_impl.super_Channel.
  mFrequency = 0;
  (p_Var4->super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>)._M_head_impl.super_Channel.
  mOutput = '\0';
  (p_Var4->super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>)._M_head_impl.super_Channel.
  mDacOn = false;
  puVar1 = (uchar *)((long)&(this->mChannels).
                            super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                            .
                            super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                            .
                            super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                            .super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl
                            .mWaveram + 0xc);
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  p_Var3 = &(this->mChannels).
            super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
            .
            super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
  ;
  (p_Var3->super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>).
  super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.mWaveVolume = '\0';
  (p_Var3->super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>).
  super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.mVolumeShift = '\0';
  (p_Var3->super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>).
  super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.mWaveIndex = '\0';
  (p_Var3->super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>).
  super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.mSampleBuffer = '\0';
  (p_Var3->super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>).
  super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.mWaveram._M_elems[0] =
       '\0';
  (p_Var3->super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>).
  super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.mWaveram._M_elems[1] =
       '\0';
  (p_Var3->super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>).
  super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.mWaveram._M_elems[2] =
       '\0';
  (p_Var3->super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>).
  super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl.mWaveram._M_elems[3] =
       '\0';
  puVar1 = (uchar *)((long)&(this->mChannels).
                            super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                            .
                            super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                            .
                            super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                            .super__Head_base<2UL,_trackerboy::apu::WaveChannel,_false>._M_head_impl
                            .mWaveram + 4);
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  *(bool *)((long)&(this->mChannels).
                   super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                   .
                   super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                   .
                   super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
                   .super__Tuple_impl<3UL,_trackerboy::apu::NoiseChannel>.
                   super__Head_base<3UL,_trackerboy::apu::NoiseChannel,_false>._M_head_impl + 4) =
       false;
  *(undefined4 *)
   &(this->mChannels).
    super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
    .
    super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
    .super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>.
    super__Tuple_impl<3UL,_trackerboy::apu::NoiseChannel>.
    super__Head_base<3UL,_trackerboy::apu::NoiseChannel,_false>._M_head_impl.super_Channel = 0;
  *(undefined4 *)
   ((long)&(this->mChannels).
           super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
           .
           super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
           .super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>.
           super__Tuple_impl<3UL,_trackerboy::apu::NoiseChannel>.
           super__Head_base<3UL,_trackerboy::apu::NoiseChannel,_false>._M_head_impl + 0x18) =
       0x7fff0001;
  *(uint32_t *)
   ((long)&(this->mChannels).
           super__Tuple_impl<0UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
           .
           super__Tuple_impl<1UL,_trackerboy::apu::PulseChannel,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>
           .super__Tuple_impl<2UL,_trackerboy::apu::WaveChannel,_trackerboy::apu::NoiseChannel>.
           super__Tuple_impl<3UL,_trackerboy::apu::NoiseChannel>.
           super__Head_base<3UL,_trackerboy::apu::NoiseChannel,_false>._M_head_impl + 0xc) = 8;
  *(undefined4 *)(this->mLastOutputs)._M_elems = 0;
  (this->mMix)._M_elems[0] = mute;
  (this->mMix)._M_elems[1] = mute;
  (this->mMix)._M_elems[2] = mute;
  (this->mMix)._M_elems[3] = mute;
  return;
}

Assistant:

void Hardware::reset() {
    std::for_each(mLengthCounters.begin(), mLengthCounters.end(), std::mem_fn(&LengthCounter::reset));
    std::for_each(mEnvelopes.begin(), mEnvelopes.end(), std::mem_fn(&Envelope::reset));
    mSweep.reset();
    mSequencer.reset();
    std::get<0>(mChannels).reset();
    std::get<1>(mChannels).reset();
    std::get<2>(mChannels).reset();
    std::get<3>(mChannels).reset();

    mMix.fill(MixMode::mute);
    mLastOutputs.fill((uint8_t)0);
}